

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResupplyReceivedPdu.cpp
# Opt level: O2

void __thiscall DIS::ResupplyReceivedPdu::ResupplyReceivedPdu(ResupplyReceivedPdu *this)

{
  LogisticsFamilyPdu::LogisticsFamilyPdu(&this->super_LogisticsFamilyPdu);
  (this->super_LogisticsFamilyPdu).super_Pdu._vptr_Pdu =
       (_func_int **)&PTR__ResupplyReceivedPdu_001b1fa0;
  EntityID::EntityID(&this->_receivingEntityID);
  EntityID::EntityID(&this->_supplyingEntityID);
  this->_numberOfSupplyTypes = '\0';
  this->_padding1 = 0;
  this->_padding2 = '\0';
  (this->_supplies).super__Vector_base<DIS::SupplyQuantity,_std::allocator<DIS::SupplyQuantity>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_supplies).super__Vector_base<DIS::SupplyQuantity,_std::allocator<DIS::SupplyQuantity>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_supplies).super__Vector_base<DIS::SupplyQuantity,_std::allocator<DIS::SupplyQuantity>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Pdu::setPduType((Pdu *)this,'\a');
  return;
}

Assistant:

ResupplyReceivedPdu::ResupplyReceivedPdu() : LogisticsFamilyPdu(),
   _receivingEntityID(), 
   _supplyingEntityID(), 
   _numberOfSupplyTypes(0), 
   _padding1(0), 
   _padding2(0)
{
    setPduType( 7 );
}